

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CheckExtensionDeclarationFieldType
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto,
          string_view type)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  string_view pc;
  string_view prefix;
  string_view text;
  undefined8 descriptor;
  bool bVar1;
  Descriptor *pDVar2;
  EnumDescriptor *pEVar3;
  AlphaNum *b;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar4;
  string_view type_00;
  string_view sVar5;
  anon_class_24_3_cfa7759b local_240;
  VoidPtr local_228;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_220;
  string_view local_218;
  DescriptorBuilder *local_208;
  size_t sStack_200;
  AlphaNum local_1f8;
  AlphaNum local_1c8;
  string local_198;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  DescriptorBuilder *local_168;
  char *local_160;
  DescriptorBuilder *local_158;
  size_t sStack_150;
  size_t local_148;
  size_t sStack_140;
  AlphaNum local_130;
  AlphaNum local_100;
  string local_d0;
  size_t sStack_b0;
  string_view full_name;
  undefined1 local_98 [8];
  string expected_type;
  allocator<char> local_61;
  string_view local_60;
  undefined1 local_50 [8];
  string actual_type;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  DescriptorBuilder *this_local;
  string_view type_local;
  
  type_local._M_len = (size_t)type._M_str;
  this_local = (DescriptorBuilder *)type._M_len;
  if ((this->had_errors_ & 1U) != 0) {
    return;
  }
  actual_type.field_2._8_8_ = proto;
  local_60 = FieldDescriptor::type_name(field);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_50,&local_60,&local_61);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_98,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             (allocator<char> *)((long)&full_name._M_str + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&full_name._M_str + 7));
  pDVar2 = FieldDescriptor::message_type(field);
  if ((pDVar2 != (Descriptor *)0x0) ||
     (pEVar3 = FieldDescriptor::enum_type(field), pcVar4 = extraout_RDX,
     pEVar3 != (EnumDescriptor *)0x0)) {
    if ((this->had_errors_ & 1U) != 0) {
      full_name._M_str._0_4_ = 1;
      goto LAB_002ff450;
    }
    pDVar2 = FieldDescriptor::message_type(field);
    if (pDVar2 == (Descriptor *)0x0) {
      pEVar3 = FieldDescriptor::enum_type(field);
      sVar5 = EnumDescriptor::full_name(pEVar3);
      sStack_b0 = sVar5._M_len;
    }
    else {
      pDVar2 = FieldDescriptor::message_type(field);
      sVar5 = Descriptor::full_name(pDVar2);
      sStack_b0 = sVar5._M_len;
    }
    full_name._M_len = (size_t)sVar5._M_str;
    b = (AlphaNum *)sVar5._M_len;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_100,".");
    local_148 = sStack_b0;
    sStack_140 = full_name._M_len;
    sVar5._M_str = (char *)full_name._M_len;
    sVar5._M_len = sStack_b0;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_130,sVar5);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_d0,(lts_20250127 *)&local_100,&local_130,b);
    std::__cxx11::string::operator=((string *)local_50,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    pcVar4 = extraout_RDX_00;
  }
  local_158 = this_local;
  sStack_150 = type_local._M_len;
  type_00._M_str = pcVar4;
  type_00._M_len = type_local._M_len;
  bVar1 = anon_unknown_24::IsNonMessageType((anon_unknown_24 *)this_local,type_00);
  if (!bVar1) {
    local_168 = this_local;
    local_160 = (char *)type_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_178,".");
    text._M_str = local_160;
    text._M_len = (size_t)local_168;
    prefix._M_str = local_178._M_str;
    prefix._M_len = local_178._M_len;
    bVar1 = absl::lts_20250127::StartsWith(text,prefix);
    if (!bVar1) {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_1c8,".");
      local_208 = this_local;
      sStack_200 = type_local._M_len;
      pc._M_str = (char *)type_local._M_len;
      pc._M_len = (size_t)this_local;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_1f8,pc);
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_198,(lts_20250127 *)&local_1c8,&local_1f8,(AlphaNum *)local_178._M_str);
      std::__cxx11::string::operator=((string *)local_98,(string *)&local_198);
      std::__cxx11::string::~string((string *)&local_198);
    }
  }
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_50);
  if (bVar1) {
    local_218 = FieldDescriptor::full_name(field);
    descriptor = actual_type.field_2._8_8_;
    local_240.expected_type = (string *)local_98;
    local_240.actual_type = (string *)local_50;
    local_240.field = field;
    absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
    FunctionRef<google::protobuf::DescriptorBuilder::CheckExtensionDeclarationFieldType(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>)::__0,void>
              ((FunctionRef<std::__cxx11::string()> *)&local_228,&local_240);
    make_error.invoker_ = p_Stack_220;
    make_error.ptr_.obj = local_228.obj;
    AddError(this,local_218,(Message *)descriptor,EXTENDEE,make_error);
  }
  full_name._M_str._0_4_ = 0;
LAB_002ff450:
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void DescriptorBuilder::CheckExtensionDeclarationFieldType(
    const FieldDescriptor& field, const FieldDescriptorProto& proto,
    absl::string_view type) {
  if (had_errors_) return;
  std::string actual_type(field.type_name());
  std::string expected_type(type);
  if (field.message_type() || field.enum_type()) {
    // Field message type descriptor can be in a partial state which will cause
    // segmentation fault if it is being accessed.
    if (had_errors_) return;
    absl::string_view full_name = field.message_type() != nullptr
                                      ? field.message_type()->full_name()
                                      : field.enum_type()->full_name();
    actual_type = absl::StrCat(".", full_name);
  }
  if (!IsNonMessageType(type) && !absl::StartsWith(type, ".")) {
    expected_type = absl::StrCat(".", type);
  }
  if (expected_type != actual_type) {
    AddError(field.full_name(), proto, DescriptorPool::ErrorCollector::EXTENDEE,
             [&] {
               return absl::Substitute(
                   "\"$0\" extension field $1 is expected to be type "
                   "\"$2\", not \"$3\".",
                   field.containing_type()->full_name(), field.number(),
                   expected_type, actual_type);
             });
  }
}